

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this,int *key)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  ulong in_RAX;
  int *piVar4;
  bool bVar5;
  uint unaff_R13D;
  uint uVar6;
  ulong uStack_38;
  
  piVar1 = this->buckets;
  uVar3 = 0;
  if (piVar1 == (Type)0x0) {
    uVar6 = 0;
    uStack_38 = in_RAX;
  }
  else {
    uVar3 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uStack_38 = (ulong)uVar3 << 0x20;
    unaff_R13D = piVar1[uVar3];
    if (-1 < (long)(int)unaff_R13D) {
      pSVar2 = this->entries;
      if (pSVar2[(int)unaff_R13D].
          super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>.
          super_ImplicitKeyValueEntry<int,_int>.
          super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
          super_ValueEntryData<int>.value == *key) {
        uVar3 = 0;
        uVar6 = 0xffffffff;
      }
      else {
        uVar3 = 0;
        do {
          uVar6 = unaff_R13D;
          uVar3 = uVar3 + 1;
          unaff_R13D = pSVar2[uVar6].
                       super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                       .super_ImplicitKeyValueEntry<int,_int>.
                       super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
                       super_ValueEntryData<int>.next;
          if ((long)(int)unaff_R13D < 0) goto LAB_0082d77c;
        } while (pSVar2[(int)unaff_R13D].
                 super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                 .super_ImplicitKeyValueEntry<int,_int>.
                 super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
                 super_ValueEntryData<int>.value != *key);
      }
      bVar5 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,uVar3);
      }
      goto LAB_0082d7c7;
    }
    uVar6 = 0xffffffff;
    uVar3 = 0;
  }
LAB_0082d77c:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar3);
  }
  bVar5 = false;
LAB_0082d7c7:
  if (bVar5 != false) {
    piVar4 = &this->entries[uVar6].
              super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .super_ImplicitKeyValueEntry<int,_int>.
              super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
              super_ValueEntryData<int>.next;
    if ((int)uVar6 < 0) {
      piVar4 = this->buckets + (uStack_38 >> 0x20);
    }
    *piVar4 = this->entries[(int)unaff_R13D].
              super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .super_ImplicitKeyValueEntry<int,_int>.
              super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
              super_ValueEntryData<int>.next;
    pSVar2 = this->entries;
    pSVar2[(int)unaff_R13D].
    super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>.
    super_ImplicitKeyValueEntry<int,_int>.
    super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
    super_ValueEntryData<int>.value = 0;
    SetNextFreeEntryIndex
              (this,pSVar2 + (int)unaff_R13D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R13D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[uStack_38 >> 0x20] == -1);
    }
  }
  return bVar5;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }